

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void chck_tqueue_set_fd(chck_tqueue *tqueue,int fd)

{
  _Bool _Var1;
  int iVar2;
  int fd_local;
  chck_tqueue *tqueue_local;
  
  if (tqueue != (chck_tqueue *)0x0) {
    if ((tqueue != (chck_tqueue *)0x0) &&
       (_Var1 = creator_thread(tqueue,"chck_tqueue_set_fd"), _Var1)) {
      if (-1 < (tqueue->tasks).fd) {
        close((tqueue->tasks).fd);
      }
      iVar2 = dup(fd);
      (tqueue->tasks).fd = iVar2;
    }
    return;
  }
  __assert_fail("tqueue",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/thread/queue/queue.c"
                ,0x118,"void chck_tqueue_set_fd(struct chck_tqueue *, int)");
}

Assistant:

void
chck_tqueue_set_fd(struct chck_tqueue *tqueue, int fd)
{
   assert(tqueue);

   // Allowed only on creator thread.
   if (!tqueue || !creator_thread(tqueue))
      return;

   if (tqueue->tasks.fd >= 0)
      close(tqueue->tasks.fd);

   tqueue->tasks.fd = dup(fd);
}